

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapid_json_serial.c
# Opt level: O0

serial_interface rapid_json_serial_impl_interface_singleton(void)

{
  return &rapid_json_serial_impl_interface_singleton::interface_instance_rapid_json;
}

Assistant:

serial_interface rapid_json_serial_impl_interface_singleton(void)
{
	static struct serial_interface_type interface_instance_rapid_json = {
		&rapid_json_serial_impl_extension,
		&rapid_json_serial_impl_initialize,
		&rapid_json_serial_impl_serialize,
		&rapid_json_serial_impl_deserialize,
		&rapid_json_serial_impl_destroy
	};

	return &interface_instance_rapid_json;
}